

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O2

int do_jz(void)

{
  undefined4 *puVar1;
  uint uVar2;
  
  if (registe_ptr->flag[0] == '\0') {
    uVar2 = registe_ptr->IP;
    if (code_ptr[uVar2 + 1] == '\x06') {
      uVar2 = registe_ptr->CS + *(int *)(code_ptr + (ulong)uVar2 + 2);
    }
    else {
      if (code_ptr[uVar2 + 1] != '\x05') {
        puVar1 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar1 = 0xf6;
        __cxa_throw(puVar1,&int::typeinfo,0);
      }
      uVar2 = *register_list[(byte)code_ptr[uVar2 + 2] >> 4];
    }
    registe_ptr->IP = uVar2;
  }
  return 1;
}

Assistant:

int do_jz() {
	if (registe_ptr->flag[0] == 0){
		if (code_ptr[registe_ptr->IP + 1] == 5) {//寄存器跳转
			uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 2] / 0x10;
			unsigned adr = *register_list[high];
			registe_ptr->IP = adr;
		}
		else if (code_ptr[registe_ptr->IP + 1] == 6) {//立即数跳转
			unsigned adr = *(unsigned*)(code_ptr + registe_ptr->IP + 2);
			registe_ptr->IP = adr + registe_ptr->CS;

		}
		else throw(LVM_EXECUTE_ERROR);
	}
	return LVM_SUCCESS;
}